

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O1

void amrex::WriteGenericPlotfileHeader
               (ostream *HeaderFile,int nlevels,
               Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *bArray,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *geom,Real time,
               Vector<int,_std::allocator<int>_> *level_steps,
               Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *ref_ratio,
               string *versionName,string *levelPrefix,string *mfPrefix)

{
  undefined8 uVar1;
  pointer pbVar2;
  long *plVar3;
  pointer pGVar4;
  pointer pGVar5;
  pointer pGVar6;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *pVVar7;
  Vector<int,_std::allocator<int>_> *pVVar8;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *pVVar9;
  ostream *poVar10;
  pointer pbVar11;
  int i;
  int iVar12;
  undefined4 in_register_00000034;
  pointer pBVar13;
  int k;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  Box result;
  char local_c1;
  undefined1 local_c0 [24];
  double adStack_a8 [3];
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  Vector<int,_std::allocator<int>_> *local_70;
  Real local_68;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *local_60;
  Box local_58;
  
  local_80 = CONCAT44(in_register_00000034,nlevels);
  local_88 = CONCAT44(local_88._4_4_,nlevels + -1);
  *(undefined8 *)(HeaderFile + *(long *)(*(long *)HeaderFile + -0x18) + 8) = 0x11;
  local_90 = geom;
  local_70 = level_steps;
  local_68 = time;
  local_60 = bArray;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (HeaderFile,(versionName->_M_dataplus)._M_p,versionName->_M_string_length);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
  poVar10 = std::ostream::_M_insert<long>((long)HeaderFile);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
  pbVar11 = (varnames->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (varnames->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 != pbVar11 && -1 < (long)pbVar2 - (long)pbVar11) {
    lVar15 = 8;
    lVar14 = 0;
    do {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (HeaderFile,*(char **)((long)pbVar11 + lVar15 + -8),
                           *(long *)((long)&(pbVar11->_M_dataplus)._M_p + lVar15));
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      lVar14 = lVar14 + 1;
      pbVar11 = (varnames->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0x20;
    } while (lVar14 < (long)(varnames->
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5);
  }
  poVar10 = (ostream *)std::ostream::operator<<(HeaderFile,3);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
  poVar10 = std::ostream::_M_insert<double>(local_68);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
  poVar10 = (ostream *)std::ostream::operator<<(HeaderFile,(int)local_88);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
  pVVar7 = local_90;
  lVar14 = 0;
  do {
    poVar10 = std::ostream::_M_insert<double>
                        (*(double *)
                          ((long)(((pVVar7->
                                   super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->prob_domain).xlo +
                          lVar14 * 8));
    local_c0[0] = ' ';
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,local_c0,1);
  uVar17 = local_80;
  lVar14 = 0;
  do {
    poVar10 = std::ostream::_M_insert<double>
                        (*(double *)
                          ((long)(((pVVar7->
                                   super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->prob_domain).xhi +
                          lVar14 * 8));
    local_c0[0] = ' ';
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,local_c0,1);
  iVar12 = (int)uVar17;
  if (1 < iVar12) {
    uVar16 = local_88 & 0xffffffff;
    lVar14 = 0;
    do {
      poVar10 = (ostream *)
                std::ostream::operator<<
                          (HeaderFile,
                           *(int *)((long)((ref_ratio->
                                           super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                           ).
                                           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->vect + lVar14
                                   ));
      local_c0[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
      lVar14 = lVar14 + 0xc;
    } while (uVar16 * 0xc != lVar14);
  }
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,local_c0,1);
  pVVar7 = local_90;
  local_78 = uVar17 & 0xffffffff;
  if (0 < iVar12) {
    lVar14 = local_78 * 200;
    lVar15 = 0;
    do {
      poVar10 = operator<<(HeaderFile,
                           (Box *)((long)&(((pVVar7->
                                            super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                            ).
                                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->domain).
                                          smallend + lVar15));
      local_c0[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
      lVar15 = lVar15 + 200;
    } while (lVar14 - lVar15 != 0);
  }
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,local_c0,1);
  pVVar8 = local_70;
  uVar17 = local_78;
  if (0 < iVar12) {
    uVar16 = 0;
    do {
      poVar10 = (ostream *)
                std::ostream::operator<<
                          (HeaderFile,
                           (pVVar8->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar16]);
      local_c0[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
      uVar16 = uVar16 + 1;
    } while (uVar17 != uVar16);
  }
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,local_c0,1);
  pVVar7 = local_90;
  if (0 < iVar12) {
    lVar14 = 0x20;
    uVar17 = 0;
    do {
      lVar15 = 0;
      do {
        poVar10 = std::ostream::_M_insert<double>
                            (*(double *)
                              ((long)(((pVVar7->
                                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                       ).
                                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).
                                     offset + lVar15 * 8 + lVar14 + 0xfffffffffffffff8U));
        local_c0[0] = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      local_c0[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,local_c0,1);
      uVar17 = uVar17 + 1;
      lVar14 = lVar14 + 200;
    } while (uVar17 != local_78);
  }
  poVar10 = (ostream *)
            std::ostream::operator<<
                      (HeaderFile,
                       (((local_90->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>)
                         .super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                         _M_impl.super__Vector_impl_data._M_start)->super_CoordSys).c_sys);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
  std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,"0\n",2);
  if (0 < (int)local_80) {
    uVar17 = 0;
    do {
      pVVar8 = local_70;
      poVar10 = (ostream *)std::ostream::operator<<(HeaderFile,(int)uVar17);
      local_c0[0] = ' ';
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
      pVVar9 = local_60;
      poVar10 = std::ostream::_M_insert<long>((long)poVar10);
      local_c0[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
      poVar10 = std::ostream::_M_insert<double>(local_68);
      local_c0[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
      local_88 = uVar17;
      poVar10 = (ostream *)
                std::ostream::operator<<
                          (HeaderFile,
                           (pVVar8->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar17]);
      local_c0[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c0,1);
      uVar16 = local_88;
      pBVar13 = (pVVar9->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                super__Vector_impl_data._M_start;
      plVar3 = *(long **)&pBVar13[uVar17].m_ref.
                          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>;
      lVar14 = plVar3[1];
      lVar15 = *plVar3;
      local_80 = uVar17 * 0x68;
      if (lVar14 != lVar15 && -1 < lVar14 - lVar15) {
        pGVar4 = (local_90->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pGVar6 = pGVar4 + local_88;
        pBVar13 = pBVar13 + uVar17;
        lVar14 = 0;
        do {
          BATransformer::operator()
                    ((Box *)local_c0,&pBVar13->m_bat,
                     (Box *)(lVar14 * 0x1c +
                            *(long *)(pBVar13->m_ref).
                                     super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr));
          iVar12 = (pGVar6->domain).smallend.vect[0];
          uVar1 = *(undefined8 *)((long)&pGVar4[uVar16].domain.smallend + 4);
          local_58.smallend.vect[0] = (int)CONCAT71(local_c0._1_7_,local_c0[0]);
          local_58.smallend.vect[1] = SUB74(local_c0._1_7_,3);
          local_58.bigend.vect[2] = (int)((ulong)uVar1 >> 0x20);
          local_58.bigend.vect[1] = (int)uVar1;
          local_58.smallend.vect[2] = local_c0._8_4_ - local_58.bigend.vect[2];
          local_58.bigend.vect[0] = local_c0._12_4_ - iVar12;
          local_58.smallend.vect[1] = local_58.smallend.vect[1] - local_58.bigend.vect[1];
          local_58.smallend.vect[0] = local_58.smallend.vect[0] - iVar12;
          local_58.bigend.vect[1] = local_c0._16_4_ - local_58.bigend.vect[1];
          local_58.bigend.vect[2] = local_c0._20_4_ - local_58.bigend.vect[2];
          pGVar5 = (local_90->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                   super__Vector_impl_data._M_start;
          RealBox::RealBox((RealBox *)local_c0,&local_58,pGVar5[uVar16].super_CoordSys.dx,
                           pGVar5[uVar16].prob_domain.xlo);
          lVar15 = 0;
          do {
            poVar10 = std::ostream::_M_insert<double>(*(double *)(local_c0 + lVar15 * 8));
            local_c1 = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,&local_c1,1);
            poVar10 = std::ostream::_M_insert<double>(adStack_a8[lVar15]);
            local_c1 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,&local_c1,1);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          lVar14 = lVar14 + 1;
          pBVar13 = (local_60->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar3 = *(long **)((long)&(pBVar13->m_ref).
                                     super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2> +
                             local_80);
          pBVar13 = (pointer)((long)&(pBVar13->m_bat).m_bat_type + local_80);
          lVar15 = (plVar3[1] - *plVar3 >> 2) * 0x6db6db6db6db6db7;
        } while (lVar15 - lVar14 != 0 && lVar14 <= lVar15);
      }
      uVar17 = local_88;
      MultiFabHeaderPath((string *)local_c0,(int)local_88,levelPrefix,mfPrefix);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (HeaderFile,(char *)CONCAT71(local_c0._1_7_,local_c0[0]),
                           CONCAT44(local_c0._12_4_,local_c0._8_4_));
      local_58.smallend.vect[0]._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_58,1);
      uVar16 = local_78;
      if ((undefined1 *)CONCAT71(local_c0._1_7_,local_c0[0]) != local_c0 + 0x10) {
        operator_delete((undefined1 *)CONCAT71(local_c0._1_7_,local_c0[0]),
                        CONCAT44(local_c0._20_4_,local_c0._16_4_) + 1);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar16);
  }
  return;
}

Assistant:

void
WriteGenericPlotfileHeader (std::ostream &HeaderFile,
                            int nlevels,
                            const Vector<BoxArray> &bArray,
                            const Vector<std::string> &varnames,
                            const Vector<Geometry> &geom,
                            Real time,
                            const Vector<int> &level_steps,
                            const Vector<IntVect> &ref_ratio,
                            const std::string &versionName,
                            const std::string &levelPrefix,
                            const std::string &mfPrefix)
{
//        BL_PROFILE("WriteGenericPlotfileHeader()");

        BL_ASSERT(nlevels <= bArray.size());
        BL_ASSERT(nlevels <= geom.size());
        BL_ASSERT(nlevels <= ref_ratio.size()+1);
        BL_ASSERT(nlevels <= level_steps.size());

        int finest_level(nlevels - 1);

        HeaderFile.precision(17);

        // ---- this is the generic plot file type name
        HeaderFile << versionName << '\n';

        HeaderFile << varnames.size() << '\n';

        for (int ivar = 0; ivar < varnames.size(); ++ivar) {
            HeaderFile << varnames[ivar] << "\n";
        }
        HeaderFile << AMREX_SPACEDIM << '\n';
        HeaderFile << time << '\n';
        HeaderFile << finest_level << '\n';
        for (int i = 0; i < AMREX_SPACEDIM; ++i) {
            HeaderFile << geom[0].ProbLo(i) << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i < AMREX_SPACEDIM; ++i) {
            HeaderFile << geom[0].ProbHi(i) << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i < finest_level; ++i) {
            HeaderFile << ref_ratio[i][0] << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i <= finest_level; ++i) {
            HeaderFile << geom[i].Domain() << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i <= finest_level; ++i) {
            HeaderFile << level_steps[i] << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i <= finest_level; ++i) {
            for (int k = 0; k < AMREX_SPACEDIM; ++k) {
                HeaderFile << geom[i].CellSize()[k] << ' ';
            }
            HeaderFile << '\n';
        }
        HeaderFile << (int) geom[0].Coord() << '\n';
        HeaderFile << "0\n";

        for (int level = 0; level <= finest_level; ++level) {
            HeaderFile << level << ' ' << bArray[level].size() << ' ' << time << '\n';
            HeaderFile << level_steps[level] << '\n';

            const IntVect& domain_lo = geom[level].Domain().smallEnd();
            for (int i = 0; i < bArray[level].size(); ++i)
            {
                // Need to shift because the RealBox ctor we call takes the
                // physical location of index (0,0,0).  This does not affect
                // the usual cases where the domain index starts with 0.
                const Box& b = amrex::shift(bArray[level][i], -domain_lo);
                RealBox loc = RealBox(b, geom[level].CellSize(), geom[level].ProbLo());
                for (int n = 0; n < AMREX_SPACEDIM; ++n) {
                    HeaderFile << loc.lo(n) << ' ' << loc.hi(n) << '\n';
                }
            }

            HeaderFile << MultiFabHeaderPath(level, levelPrefix, mfPrefix) << '\n';
        }
}